

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O0

void __thiscall
ElementsAddressFactory_GetSegwitAddressByHash_Test::
~ElementsAddressFactory_GetSegwitAddressByHash_Test
          (ElementsAddressFactory_GetSegwitAddressByHash_Test *this)

{
  void *in_RDI;
  
  ~ElementsAddressFactory_GetSegwitAddressByHash_Test
            ((ElementsAddressFactory_GetSegwitAddressByHash_Test *)0x2007e8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(ElementsAddressFactory, GetSegwitAddressByHash)
{
  {
    ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList());
    Address address = factory.GetSegwitAddressByHash(ByteData("c4d571179a455b8976b79cf99183fd2bbafe6bfd"));
    EXPECT_STREQ(address.GetHash().GetHex().c_str(), "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
    EXPECT_EQ(address.GetAddressType(), AddressType::kP2wpkhAddress);

    EXPECT_THROW(factory.GetSegwitAddressByHash(ByteData()), CfdException);
    EXPECT_THROW(factory.GetSegwitAddressByHash(ByteData("0000")), CfdException);
  }
}